

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O0

void __thiscall
amrex::EB2::Level::fillAreaFrac(Level *this,Array<MultiFab_*,_3> *a_areafrac,Geometry *geom)

{
  uint uVar1;
  ulong uVar2;
  pointer pIVar3;
  bool bVar4;
  const_reference ppMVar5;
  BaseFab<double> *this_00;
  Level *in_RDI;
  Periodicity PVar6;
  Box bx_1;
  Box *fbx;
  int idim_2;
  pair<int,_amrex::Box> *is;
  iterator __end5;
  iterator __begin5;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range5;
  IntVect *iv;
  const_iterator __end4;
  const_iterator __begin4;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__range4;
  Array4<double> *apz;
  Array4<double> *apy;
  Array4<double> *apx;
  Box bx;
  Box *ccbx;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *pshifts;
  MultiFab *areafrac;
  int idim_1;
  int idim;
  int i;
  int in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_fffffffffffffc40;
  BoxArray *pBVar7;
  undefined8 in_stack_fffffffffffffc50;
  uchar flags_;
  Box *bx_00;
  FabArrayBase *in_stack_fffffffffffffc58;
  double *x;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined4 uVar8;
  FabArrayBase *in_stack_fffffffffffffc68;
  BoxArray *in_stack_fffffffffffffc70;
  Periodicity *in_stack_fffffffffffffc88;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc90;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc98;
  uint local_358;
  undefined1 local_354 [4];
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  CpOp in_stack_fffffffffffffcc0;
  undefined1 local_33c [4];
  undefined1 *local_338;
  int local_32c;
  reference local_328;
  pair<int,_amrex::Box> *local_320;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_318;
  undefined1 *local_310;
  Box local_304;
  reference local_2e8;
  IntVect *local_2e0;
  __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
  local_2d8;
  undefined1 *local_2d0;
  undefined1 local_2c8 [64];
  undefined1 *local_288;
  undefined1 local_280 [64];
  undefined1 *local_240;
  undefined1 local_238 [64];
  undefined1 *local_1f8;
  double local_1ec;
  undefined8 local_1e4;
  undefined8 local_1dc;
  undefined4 local_1d4;
  double *local_1d0;
  MFIter local_1b8;
  undefined1 local_158 [24];
  IntVect local_140;
  undefined8 local_12c;
  int local_124;
  undefined1 local_120 [24];
  undefined1 *local_108;
  IntVect local_100;
  undefined1 local_ec [176];
  uint local_3c;
  undefined4 *local_38;
  undefined4 local_30;
  uint local_2c;
  long local_28;
  uint local_1c;
  undefined4 *local_18;
  uint local_c;
  undefined4 *local_8;
  
  for (local_ec._24_4_ = 0; (int)local_ec._24_4_ < 3; local_ec._24_4_ = local_ec._24_4_ + 1) {
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
               CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffc30,
               (value_type)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  }
  bVar4 = isAllRegular(in_RDI);
  if (!bVar4) {
    for (local_ec._20_4_ = 0; flags_ = (uchar)((ulong)in_stack_fffffffffffffc50 >> 0x38),
        (int)local_ec._20_4_ < 3; local_ec._20_4_ = local_ec._20_4_ + 1) {
      ppMVar5 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                          ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
                           CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      in_stack_fffffffffffffc68 = (FabArrayBase *)*ppMVar5;
      local_ec._12_8_ = in_stack_fffffffffffffc68;
      in_stack_fffffffffffffc70 =
           (BoxArray *)
           std::array<amrex::MultiFab,_3UL>::operator[]
                     ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffc30,
                      CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      FabArrayBase::nComp((FabArrayBase *)local_ec._12_8_);
      in_stack_fffffffffffffc28 = FabArrayBase::nGrow((FabArrayBase *)local_ec._12_8_,0);
      PVar6 = Geometry::periodicity
                        ((Geometry *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      pIVar3 = _local_354;
      local_100.vect._0_8_ = PVar6.period.vect._0_8_;
      local_ec._0_4_ = local_100.vect[0];
      local_ec._4_4_ = local_100.vect[1];
      local_100.vect[2] = PVar6.period.vect[2];
      local_ec._8_4_ = local_100.vect[2];
      in_stack_fffffffffffffc30 = (FabArray<amrex::FArrayBox> *)local_ec;
      in_stack_fffffffffffffc38 = 0;
      uVar2 = (ulong)_local_354 >> 0x20;
      local_100 = PVar6.period.vect;
      FabArray<amrex::FArrayBox>::ParallelCopy
                (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                 (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),(int)in_stack_fffffffffffffc88,
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)uVar2,
                 (Periodicity *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                 in_stack_fffffffffffffcc0);
      _local_354 = pIVar3;
    }
    PVar6 = Geometry::periodicity
                      ((Geometry *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    local_140.vect._0_8_ = PVar6.period.vect._0_8_;
    local_12c._0_4_ = local_140.vect[0];
    local_12c._4_4_ = local_140.vect[1];
    local_140.vect[2] = PVar6.period.vect[2];
    local_124 = local_140.vect[2];
    local_140 = PVar6.period.vect;
    Periodicity::shiftIntVect(in_stack_fffffffffffffc88);
    local_108 = local_120;
    bVar4 = BoxArray::empty((BoxArray *)0x149a691);
    if (!bVar4) {
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )0x149a6a6);
      uVar8 = 0;
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
                 CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      MFIter::MFIter((MFIter *)CONCAT44(uVar8,in_stack_fffffffffffffc60),in_stack_fffffffffffffc58,
                     flags_);
      while (bVar4 = MFIter::isValid(&local_1b8), bVar4) {
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        this_00 = &FabArray<amrex::FArrayBox>::operator[]
                             (in_stack_fffffffffffffc30,
                              (MFIter *)
                              CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28))->
                   super_BaseFab<double>;
        local_ec._68_8_ = BaseFab<double>::box(this_00);
        local_1ec = *(double *)(((Box *)local_ec._68_8_)->smallend).vect;
        local_1e4 = *(undefined8 *)((((Box *)local_ec._68_8_)->smallend).vect + 2);
        local_1dc = *(undefined8 *)((((Box *)local_ec._68_8_)->bigend).vect + 1);
        uVar1 = (((Box *)local_ec._68_8_)->btype).itype;
        x = &local_1ec;
        for (local_ec._160_4_ = 0; (int)local_ec._160_4_ < 3;
            local_ec._160_4_ = local_ec._160_4_ + 1) {
          local_38 = &local_1d4;
          local_3c = local_ec._160_4_;
          local_1c = local_ec._160_4_;
          local_c = local_ec._160_4_;
          if ((uVar1 & 1 << ((byte)local_ec._160_4_ & 0x1f)) != 0) {
            local_28 = (long)&local_1e4 + 4;
            local_2c = local_ec._160_4_;
            local_30 = 0xffffffff;
            *(int *)(local_28 + (long)(int)local_ec._160_4_ * 4) =
                 *(int *)(local_28 + (long)(int)local_ec._160_4_ * 4) + -1;
          }
          local_18 = local_38;
        }
        local_8 = &local_1d4;
        local_1d4 = 0;
        local_1d0 = &local_1ec;
        local_ec._164_8_ = x;
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   (MFIter *)in_stack_fffffffffffffc30);
        local_1f8 = local_238;
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   (MFIter *)in_stack_fffffffffffffc30);
        local_240 = local_280;
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   (MFIter *)in_stack_fffffffffffffc30);
        local_288 = local_2c8;
        local_2d0 = local_108;
        local_2d8._M_current =
             (IntVect *)
             std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::begin
                       ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        local_2e0 = (IntVect *)
                    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::end
                              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                   *)in_stack_fffffffffffffc30,
                                  (__normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)),
              bVar4) {
          local_2e8 = __gnu_cxx::
                      __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
                      ::operator*(&local_2d8);
          pBVar7 = &in_RDI->m_covered_grids;
          bx_00 = &local_304;
          Box::operator+((Box *)in_stack_fffffffffffffc30,
                         (IntVect *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          BoxArray::intersections
                    (in_stack_fffffffffffffc70,(Box *)in_stack_fffffffffffffc68,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)CONCAT44(uVar8,in_stack_fffffffffffffc60));
          local_310 = local_158;
          local_318._M_current =
               (pair<int,_amrex::Box> *)
               std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               ::begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          local_320 = (pair<int,_amrex::Box> *)
                      std::
                      vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ::end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          while (bVar4 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                     *)in_stack_fffffffffffffc30,
                                    (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                                   ), bVar4) {
            local_328 = __gnu_cxx::
                        __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                        ::operator*(&local_318);
            for (local_32c = 0; local_32c < 3; local_32c = local_32c + 1) {
              Box::operator-((Box *)in_stack_fffffffffffffc30,
                             (IntVect *)
                             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
              local_ec._60_8_ = &stack0xfffffffffffffc90;
              local_ec._56_4_ = local_32c;
              in_stack_fffffffffffffc40 =
                   (vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)local_354;
              local_ec._80_4_ = local_32c;
              local_ec._100_8_ = local_33c;
              local_ec._96_4_ = local_32c;
              local_ec._128_4_ = local_32c;
              local_ec._140_4_ = local_32c;
              if ((local_358 & 1 << ((byte)local_32c & 0x1f)) == 0) {
                local_ec._112_4_ = local_32c;
                local_ec._108_4_ = 1;
                *(int *)(&stack0xfffffffffffffcb8 + (long)local_32c * 4) =
                     *(int *)(&stack0xfffffffffffffcb8 + (long)local_32c * 4) + 1;
                local_ec._148_8_ = local_33c;
                local_ec._144_4_ = local_32c;
                local_ec._156_4_ = local_32c;
                local_ec._116_8_ = &stack0xfffffffffffffcb8;
              }
              local_338 = local_354;
              local_ec._84_8_ = in_stack_fffffffffffffc40;
              local_ec._132_8_ = local_ec._100_8_;
              std::array<amrex::MultiFab_*,_3UL>::operator[]
                        ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffc30,
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
              FabArray<amrex::FArrayBox>::operator[]
                        (in_stack_fffffffffffffc30,
                         (MFIter *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
              BaseFab<double>::setVal<(amrex::RunOn)1>
                        ((BaseFab<double> *)CONCAT44(uVar8,in_stack_fffffffffffffc60),x,bx_00,
                         (int)((ulong)pBVar7 >> 0x20),(int)pBVar7);
            }
            __gnu_cxx::
            __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
            ::operator++(&local_318);
          }
          __gnu_cxx::
          __normal_iterator<const_amrex::IntVect_*,_std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>_>
          ::operator++(&local_2d8);
        }
        MFIter::operator++(&local_1b8);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffffc30);
      std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffc40);
    }
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~vector(in_stack_fffffffffffffc40)
    ;
  }
  return;
}

Assistant:

void
Level::fillAreaFrac (Array<MultiFab*,AMREX_SPACEDIM> const& a_areafrac, const Geometry& geom) const
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        a_areafrac[idim]->setVal(1.0);
    }

    if (isAllRegular()) return;

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        auto& areafrac = *a_areafrac[idim];
        areafrac.ParallelCopy(m_areafrac[idim],0,0,areafrac.nComp(),
                              0,areafrac.nGrow(),geom.periodicity());
    }

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(*a_areafrac[0]); mfi.isValid(); ++mfi)
        {
            const Box& ccbx = amrex::enclosedCells((*a_areafrac[0])[mfi].box());
            AMREX_D_TERM(auto const& apx = a_areafrac[0]->array(mfi);,
                         auto const& apy = a_areafrac[1]->array(mfi);,
                         auto const& apz = a_areafrac[2]->array(mfi););
            for (const auto& iv : pshifts)
            {
                m_covered_grids.intersections(ccbx+iv, isects);
                for (const auto& is : isects) {
                    if (Gpu::inLaunchRegion()) {
                        const Box& bx = is.second-iv;
                        AMREX_D_TERM(const Box& xbx = amrex::surroundingNodes(bx,0);,
                                     const Box& ybx = amrex::surroundingNodes(bx,1);,
                                     const Box& zbx = amrex::surroundingNodes(bx,2););
                        amrex::ParallelFor(AMREX_D_DECL(xbx,ybx,zbx),
                          [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apx(i,j,k) = 0.0;
                          }
#if (AMREX_SPACEDIM >= 2)
                        , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apy(i,j,k) = 0.0;
                          }
#if (AMREX_SPACEDIM == 3)
                        , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                          {
                              apz(i,j,k) = 0.0;
                          }
#endif
#endif
                        );
                    } else {
                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                            const Box& fbx = amrex::surroundingNodes(is.second-iv,idim);
                            (*a_areafrac[idim])[mfi].setVal<RunOn::Host>(0.0, fbx, 0, 1);
                        }
                    }
                }
            }
        }
    }
}